

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

string * cmState::GetTargetTypeName_abi_cxx11_(TargetType targetType)

{
  int iVar1;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  TargetType local_14;
  string *psStack_10;
  TargetType targetType_local;
  
  local_14 = targetType;
  if ((GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propSTATIC_LIBRARY_abi_cxx11_ == '\0'
      ) && (iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                         propSTATIC_LIBRARY_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                propSTATIC_LIBRARY_abi_cxx11_,"STATIC_LIBRARY",&local_15);
    std::allocator<char>::~allocator(&local_15);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propSTATIC_LIBRARY_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                         propSTATIC_LIBRARY_abi_cxx11_);
  }
  if ((GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propMODULE_LIBRARY_abi_cxx11_ == '\0'
      ) && (iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                         propMODULE_LIBRARY_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                propMODULE_LIBRARY_abi_cxx11_,"MODULE_LIBRARY",local_25);
    std::allocator<char>::~allocator(local_25);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propMODULE_LIBRARY_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                         propMODULE_LIBRARY_abi_cxx11_);
  }
  if ((GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propSHARED_LIBRARY_abi_cxx11_ == '\0'
      ) && (iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                         propSHARED_LIBRARY_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                propSHARED_LIBRARY_abi_cxx11_,"SHARED_LIBRARY",&local_26);
    std::allocator<char>::~allocator(&local_26);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propSHARED_LIBRARY_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                         propSHARED_LIBRARY_abi_cxx11_);
  }
  if ((GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propOBJECT_LIBRARY_abi_cxx11_ == '\0'
      ) && (iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                         propOBJECT_LIBRARY_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                propOBJECT_LIBRARY_abi_cxx11_,"OBJECT_LIBRARY",&local_27);
    std::allocator<char>::~allocator(&local_27);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propOBJECT_LIBRARY_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                         propOBJECT_LIBRARY_abi_cxx11_);
  }
  if ((GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propEXECUTABLE_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                   propEXECUTABLE_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propEXECUTABLE_abi_cxx11_,
               "EXECUTABLE",&local_28);
    std::allocator<char>::~allocator(&local_28);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propEXECUTABLE_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                         propEXECUTABLE_abi_cxx11_);
  }
  if ((GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propUTILITY_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                   propUTILITY_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propUTILITY_abi_cxx11_,
               "UTILITY",&local_29);
    std::allocator<char>::~allocator(&local_29);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propUTILITY_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                         propUTILITY_abi_cxx11_);
  }
  if ((GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propGLOBAL_TARGET_abi_cxx11_ == '\0')
     && (iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                      propGLOBAL_TARGET_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propGLOBAL_TARGET_abi_cxx11_
               ,"GLOBAL_TARGET",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propGLOBAL_TARGET_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                         propGLOBAL_TARGET_abi_cxx11_);
  }
  if ((GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propINTERFACE_LIBRARY_abi_cxx11_ ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                   propINTERFACE_LIBRARY_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                propINTERFACE_LIBRARY_abi_cxx11_,"INTERFACE_LIBRARY",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propINTERFACE_LIBRARY_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                         propINTERFACE_LIBRARY_abi_cxx11_);
  }
  if ((GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propUNKNOWN_LIBRARY_abi_cxx11_ ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                   propUNKNOWN_LIBRARY_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                propUNKNOWN_LIBRARY_abi_cxx11_,"UNKNOWN_LIBRARY",&local_2c);
    std::allocator<char>::~allocator(&local_2c);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propUNKNOWN_LIBRARY_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                         propUNKNOWN_LIBRARY_abi_cxx11_);
  }
  if ((GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propEmpty_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                   propEmpty_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propEmpty_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propEmpty_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                         propEmpty_abi_cxx11_);
  }
  switch(local_14) {
  case EXECUTABLE:
    psStack_10 = &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propEXECUTABLE_abi_cxx11_;
    break;
  case STATIC_LIBRARY:
    psStack_10 = &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propSTATIC_LIBRARY_abi_cxx11_;
    break;
  case SHARED_LIBRARY:
    psStack_10 = &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propSHARED_LIBRARY_abi_cxx11_;
    break;
  case MODULE_LIBRARY:
    psStack_10 = &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propMODULE_LIBRARY_abi_cxx11_;
    break;
  case OBJECT_LIBRARY:
    psStack_10 = &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propOBJECT_LIBRARY_abi_cxx11_;
    break;
  case UTILITY:
    psStack_10 = &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propUTILITY_abi_cxx11_;
    break;
  case GLOBAL_TARGET:
    psStack_10 = &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propGLOBAL_TARGET_abi_cxx11_;
    break;
  case INTERFACE_LIBRARY:
    psStack_10 = &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propINTERFACE_LIBRARY_abi_cxx11_;
    break;
  case UNKNOWN_LIBRARY:
    psStack_10 = &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propUNKNOWN_LIBRARY_abi_cxx11_;
    break;
  default:
    __assert_fail("false && \"Unexpected target type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                  ,0x4b,
                  "static const std::string &cmState::GetTargetTypeName(cmStateEnums::TargetType)");
  }
  return psStack_10;
}

Assistant:

const std::string& cmState::GetTargetTypeName(
  cmStateEnums::TargetType targetType)
{
#define MAKE_STATIC_PROP(PROP) static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(STATIC_LIBRARY);
  MAKE_STATIC_PROP(MODULE_LIBRARY);
  MAKE_STATIC_PROP(SHARED_LIBRARY);
  MAKE_STATIC_PROP(OBJECT_LIBRARY);
  MAKE_STATIC_PROP(EXECUTABLE);
  MAKE_STATIC_PROP(UTILITY);
  MAKE_STATIC_PROP(GLOBAL_TARGET);
  MAKE_STATIC_PROP(INTERFACE_LIBRARY);
  MAKE_STATIC_PROP(UNKNOWN_LIBRARY);
  static const std::string propEmpty;
#undef MAKE_STATIC_PROP

  switch (targetType) {
    case cmStateEnums::STATIC_LIBRARY:
      return propSTATIC_LIBRARY;
    case cmStateEnums::MODULE_LIBRARY:
      return propMODULE_LIBRARY;
    case cmStateEnums::SHARED_LIBRARY:
      return propSHARED_LIBRARY;
    case cmStateEnums::OBJECT_LIBRARY:
      return propOBJECT_LIBRARY;
    case cmStateEnums::EXECUTABLE:
      return propEXECUTABLE;
    case cmStateEnums::UTILITY:
      return propUTILITY;
    case cmStateEnums::GLOBAL_TARGET:
      return propGLOBAL_TARGET;
    case cmStateEnums::INTERFACE_LIBRARY:
      return propINTERFACE_LIBRARY;
    case cmStateEnums::UNKNOWN_LIBRARY:
      return propUNKNOWN_LIBRARY;
  }
  assert(false && "Unexpected target type");
  return propEmpty;
}